

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_ldrddi.cpp
# Opt level: O0

ze_result_t
loader::zesEngineGetProperties(zes_engine_handle_t hEngine,zes_engine_properties_t *pProperties)

{
  zes_pfnEngineGetProperties_t pfnGetProperties;
  dditable_t *dditable;
  ze_result_t result;
  zes_engine_properties_t *pProperties_local;
  zes_engine_handle_t hEngine_local;
  
  if (*(code **)(*(long *)(hEngine + 8) + 0xb60) == (code *)0x0) {
    hEngine_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  else {
    hEngine_local._4_4_ =
         (**(code **)(*(long *)(hEngine + 8) + 0xb60))(*(undefined8 *)hEngine,pProperties);
  }
  return hEngine_local._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zesEngineGetProperties(
        zes_engine_handle_t hEngine,                    ///< [in] Handle for the component.
        zes_engine_properties_t* pProperties            ///< [in,out] The properties for the specified engine group.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // extract driver's function pointer table
        auto dditable = reinterpret_cast<zes_engine_object_t*>( hEngine )->dditable;
        auto pfnGetProperties = dditable->zes.Engine.pfnGetProperties;
        if( nullptr == pfnGetProperties )
            return ZE_RESULT_ERROR_UNINITIALIZED;

        // convert loader handle to driver handle
        hEngine = reinterpret_cast<zes_engine_object_t*>( hEngine )->handle;

        // forward to device-driver
        result = pfnGetProperties( hEngine, pProperties );

        return result;
    }